

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void kj::_::Debug::log<char_const(&)[54],__29,int>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [54],
               anon_enum_32 *params_1,int *params_2)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ArrayPtr<kj::String> argValues_00;
  undefined4 in_register_00000014;
  int *extraout_RDX;
  long lVar4;
  undefined4 in_register_00000034;
  String *result;
  String argValues [3];
  String *in_stack_ffffffffffffff68;
  int *in_stack_ffffffffffffff70;
  int *piVar5;
  undefined1 local_88 [16];
  String local_78;
  String local_60;
  String local_48;
  
  str<char_const(&)[54]>
            (&local_78,(kj *)"failed: expected (IPPROTO_IP) == (message.getLevel())",
             (char (*) [54])CONCAT44(in_register_00000014,severity));
  Stringifier::operator*
            ((CappedArray<char,_14UL> *)&stack0xffffffffffffff70,(Stringifier *)&_::STR,
             *(int *)CONCAT44(in_register_00000034,line));
  heapString(&local_60,(size_t)in_stack_ffffffffffffff70);
  piVar5 = in_stack_ffffffffffffff70;
  if (in_stack_ffffffffffffff70 != (int *)0x0) {
    if ((char *)local_60.content.size_ != (char *)0x0) {
      local_60.content.size_ = (size_t)local_60.content.ptr;
    }
    memcpy((void *)local_60.content.size_,local_88,(size_t)in_stack_ffffffffffffff70);
    in_stack_ffffffffffffff70 = extraout_RDX;
  }
  str<int&>(&local_48,(kj *)CONCAT44(in_register_00000014,severity),in_stack_ffffffffffffff70);
  argValues_00.size_ = (size_t)piVar5;
  argValues_00.ptr = in_stack_ffffffffffffff68;
  logInternal((Debug *)
              "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
              ,(char *)((ulong)file & 0xffffffff),2,0x37bde2,(char *)&local_78,argValues_00);
  lVar4 = 0x30;
  do {
    lVar1 = *(long *)((long)&local_78.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_78.content.size_ + lVar4);
      *(undefined8 *)((long)&local_78.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_78.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_78.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}